

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O0

void Rand_state_init(uint32_t seed)

{
  uint uVar1;
  int local_10;
  int j;
  int i;
  uint32_t seed_local;
  
  STATE[0] = seed;
  for (local_10 = 1; local_10 < 0x20; local_10 = local_10 + 1) {
    STATE[local_10] = STATE[local_10 + -1] * 0x41c64e6d + 0x3039;
  }
  for (local_10 = 0; local_10 < 0x140; local_10 = local_10 + 1) {
    uVar1 = state_i + 1 & 0x1f;
    STATE[(int)uVar1] = STATE[state_i] + STATE[(int)uVar1];
    state_i = uVar1;
  }
  return;
}

Assistant:

void Rand_state_init(uint32_t seed)
{
	int i, j;

	/* Seed the table */
	STATE[0] = seed;

	/* Propagate the seed */
	for (i = 1; i < RAND_DEG; i++)
		STATE[i] = LCRNG(STATE[i - 1]);

	/* Cycle the table ten times per degree */
	for (i = 0; i < RAND_DEG * 10; i++) {
		/* Acquire the next index */
		j = (state_i + 1) % RAND_DEG;

		/* Update the table, extract an entry */
		STATE[j] += STATE[state_i];

		/* Advance the index */
		state_i = j;
	}
}